

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::readDisplayBuffer(GLEngine *this)

{
  PFNGLREADPIXELSPROC p_Var1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  reference pvVar2;
  allocator_type *in_RDI;
  size_t buffSize;
  int h;
  int w;
  GLint viewport [4];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buff;
  allocator_type *__n;
  GLint local_28 [2];
  int local_20;
  int local_1c;
  
  __n = in_RDI;
  (*glad_glFlush)();
  (*glad_glFinish)();
  (*glad_glGetIntegerv)(0xba2,local_28);
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(long)(local_20 * local_1c * 4)
  ;
  geometrycentral::surface::std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)0x3ebf52);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(this_00,(size_type)__n,in_RDI);
  geometrycentral::surface::std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)0x3ebf72);
  p_Var1 = glad_glReadPixels;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      CONCAT44(local_1c,local_20));
  (*p_Var1)(0,0,local_20,local_1c,0x1908,0x1401,pvVar2);
  return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI;
}

Assistant:

std::vector<unsigned char> GLEngine::readDisplayBuffer() {

  // TODO do we need to bind here?

  glFlush();
  glFinish();

  // Get buffer size
  GLint viewport[4];
  glGetIntegerv(GL_VIEWPORT, viewport);
  int w = viewport[2];
  int h = viewport[3];

  // Read from openGL
  size_t buffSize = w * h * 4;
  std::vector<unsigned char> buff(buffSize);
  glReadPixels(0, 0, w, h, GL_RGBA, GL_UNSIGNED_BYTE, &(buff.front()));

  return buff;
}